

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswTable.c
# Opt level: O3

int Csw_TableCountCuts(Csw_Man_t *p)

{
  int iVar1;
  long lVar2;
  Csw_Cut_t *pCVar3;
  
  if (0 < (long)p->nTableSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      pCVar3 = (Csw_Cut_t *)(p->pTable + lVar2);
      iVar1 = iVar1 + -1;
      do {
        pCVar3 = pCVar3->pNext;
        iVar1 = iVar1 + 1;
      } while (pCVar3 != (Csw_Cut_t *)0x0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != p->nTableSize);
    return iVar1;
  }
  return 0;
}

Assistant:

int Csw_TableCountCuts( Csw_Man_t * p )
{
    Csw_Cut_t * pEnt;
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
        for ( pEnt = p->pTable[i]; pEnt; pEnt = pEnt->pNext )
            Counter++;
    return Counter;
}